

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.c
# Opt level: O0

int internal_verify(X509_STORE_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  OPENSSL_STACK *pOVar4;
  X509 *pXVar5;
  long in_RDI;
  int ret;
  int issuer_depth;
  EVP_PKEY *pkey;
  X509 *xs;
  X509 *xi;
  int n;
  X509 *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  X509 *in_stack_ffffffffffffffd0;
  X509 *subject;
  X509 *local_20;
  int local_14;
  
  pOVar4 = ossl_check_const_X509_sk_type(*(stack_st_X509 **)(in_RDI + 0x98));
  iVar1 = OPENSSL_sk_num(pOVar4);
  local_14 = iVar1 + -1;
  pOVar4 = ossl_check_const_X509_sk_type(*(stack_st_X509 **)(in_RDI + 0x98));
  local_20 = (X509 *)OPENSSL_sk_value(pOVar4,local_14);
  *(int *)(in_RDI + 0xac) = local_14;
  pXVar5 = local_20;
  if (*(int *)(in_RDI + 0xf8) == 0) {
    iVar2 = ossl_x509_likely_issued
                      ((X509 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (X509 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if ((iVar2 != 0) && ((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x80000) == 0)) {
      if (local_14 < 1) {
        iVar1 = verify_cb_cert((X509_STORE_CTX *)in_stack_ffffffffffffffd0,
                               (X509 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                               ,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        local_14 = iVar1 + -2;
        *(int *)(in_RDI + 0xac) = local_14;
        pOVar4 = ossl_check_const_X509_sk_type(*(stack_st_X509 **)(in_RDI + 0x98));
        pXVar5 = (X509 *)OPENSSL_sk_value(pOVar4,local_14);
      }
    }
  }
  else {
    local_20 = (X509 *)0x0;
  }
  while( true ) {
    subject = pXVar5;
    if (local_14 < 0) {
      return 1;
    }
    if ((local_20 != (X509 *)0x0) &&
       ((subject != local_20 ||
        (((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x4000) != 0 &&
         ((local_20->ex_flags & 0x2000) != 0)))))) {
      in_stack_ffffffffffffffcc = local_14 + (uint)(subject != local_20);
      if ((subject == local_20) && ((local_20->ex_flags & 0x10) == 0)) {
        iVar1 = 0;
      }
      else {
        iVar1 = ossl_x509_signing_allowed(local_20,subject);
      }
      iVar2 = iVar1;
      if ((iVar1 != 0) &&
         (iVar3 = verify_cb_cert((X509_STORE_CTX *)in_stack_ffffffffffffffd0,
                                 (X509 *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),iVar1,
                                 in_stack_ffffffffffffffc0), iVar3 == 0)) {
        return 0;
      }
      in_stack_ffffffffffffffd0 = (X509 *)X509_get0_pubkey(in_stack_ffffffffffffffb8);
      if (in_stack_ffffffffffffffd0 == (X509 *)0x0) {
        iVar1 = verify_cb_cert((X509_STORE_CTX *)0x0,
                               (X509 *)CONCAT44(in_stack_ffffffffffffffcc,iVar2),iVar1,
                               in_stack_ffffffffffffffc0);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        iVar3 = X509_verify((X509 *)subject,(EVP_PKEY *)in_stack_ffffffffffffffd0);
        if ((iVar3 < 1) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)in_stack_ffffffffffffffd0,
                                   (X509 *)CONCAT44(in_stack_ffffffffffffffcc,iVar2),iVar1,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
      }
    }
    iVar1 = ossl_x509_check_cert_time
                      ((X509_STORE_CTX *)subject,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc
                      );
    if (iVar1 == 0) {
      return 0;
    }
    *(X509 **)(in_RDI + 0xc0) = local_20;
    *(X509 **)(in_RDI + 0xb8) = subject;
    *(int *)(in_RDI + 0xac) = local_14;
    iVar1 = (**(code **)(in_RDI + 0x38))(1,in_RDI);
    if (iVar1 == 0) break;
    local_14 = local_14 + -1;
    pXVar5 = subject;
    if (-1 < local_14) {
      pOVar4 = ossl_check_const_X509_sk_type(*(stack_st_X509 **)(in_RDI + 0x98));
      pXVar5 = (X509 *)OPENSSL_sk_value(pOVar4,local_14);
      local_20 = subject;
    }
  }
  return 0;
}

Assistant:

static int internal_verify(X509_STORE_CTX *ctx)
{
    int n = sk_X509_num(ctx->chain) - 1;
    X509 *xi = sk_X509_value(ctx->chain, n);
    X509 *xs = xi;

    ctx->error_depth = n;
    if (ctx->bare_ta_signed) {
        /*
         * With DANE-verified bare public key TA signatures,
         * on the top certificate we check only the timestamps.
         * We report the issuer as NULL because all we have is a bare key.
         */
        xi = NULL;
    } else if (ossl_x509_likely_issued(xi, xi) != X509_V_OK
               /* exceptional case: last cert in the chain is not self-issued */
               && ((ctx->param->flags & X509_V_FLAG_PARTIAL_CHAIN) == 0)) {
        if (n > 0) {
            n--;
            ctx->error_depth = n;
            xs = sk_X509_value(ctx->chain, n);
        } else {
            CB_FAIL_IF(1, ctx, xi, 0,
                       X509_V_ERR_UNABLE_TO_VERIFY_LEAF_SIGNATURE);
        }
        /*
         * The below code will certainly not do a
         * self-signature check on xi because it is not self-issued.
         */
    }

    /*
     * Do not clear error (by ctx->error = X509_V_OK), it must be "sticky",
     * only the user's callback is allowed to reset errors (at its own peril).
     */
    while (n >= 0) {
        /*-
         * For each iteration of this loop:
         * n is the subject depth
         * xs is the subject cert, for which the signature is to be checked
         * xi is NULL for DANE-verified bare public key TA signatures
         *       else the supposed issuer cert containing the public key to use
         * Initially xs == xi if the last cert in the chain is self-issued.
         */
        /*
         * Do signature check for self-signed certificates only if explicitly
         * asked for because it does not add any security and just wastes time.
         */
        if (xi != NULL
            && (xs != xi
                || ((ctx->param->flags & X509_V_FLAG_CHECK_SS_SIGNATURE) != 0
                    && (xi->ex_flags & EXFLAG_SS) != 0))) {
            EVP_PKEY *pkey;
            /*
             * If the issuer's public key is not available or its key usage
             * does not support issuing the subject cert, report the issuer
             * cert and its depth (rather than n, the depth of the subject).
             */
            int issuer_depth = n + (xs == xi ? 0 : 1);
            /*
             * According to https://tools.ietf.org/html/rfc5280#section-6.1.4
             * step (n) we must check any given key usage extension in a CA cert
             * when preparing the verification of a certificate issued by it.
             * According to https://tools.ietf.org/html/rfc5280#section-4.2.1.3
             * we must not verify a certificate signature if the key usage of
             * the CA certificate that issued the certificate prohibits signing.
             * In case the 'issuing' certificate is the last in the chain and is
             * not a CA certificate but a 'self-issued' end-entity cert (i.e.,
             * xs == xi && !(xi->ex_flags & EXFLAG_CA)) RFC 5280 does not apply
             * (see https://tools.ietf.org/html/rfc6818#section-2) and thus
             * we are free to ignore any key usage restrictions on such certs.
             */
            int ret = xs == xi && (xi->ex_flags & EXFLAG_CA) == 0
                ? X509_V_OK : ossl_x509_signing_allowed(xi, xs);

            CB_FAIL_IF(ret != X509_V_OK, ctx, xi, issuer_depth, ret);
            if ((pkey = X509_get0_pubkey(xi)) == NULL) {
                CB_FAIL_IF(1, ctx, xi, issuer_depth,
                           X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY);
            } else {
                CB_FAIL_IF(X509_verify(xs, pkey) <= 0,
                           ctx, xs, n, X509_V_ERR_CERT_SIGNATURE_FAILURE);
            }
        }

        /* In addition to RFC 5280 requirements do also for trust anchor cert */
        /* Calls verify callback as needed */
        if (!ossl_x509_check_cert_time(ctx, xs, n))
            return 0;

        /*
         * Signal success at this depth.  However, the previous error (if any)
         * is retained.
         */
        ctx->current_issuer = xi;
        ctx->current_cert = xs;
        ctx->error_depth = n;
        if (!ctx->verify_cb(1, ctx))
            return 0;

        if (--n >= 0) {
            xi = xs;
            xs = sk_X509_value(ctx->chain, n);
        }
    }
    return 1;
}